

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::DynamicObject::HasPropertyQuery
          (DynamicObject *this,PropertyId propertyId,PropertyValueInfo *info)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int val;
  PropertyQueryFlags PVar4;
  undefined4 *puVar5;
  DynamicTypeHandler *pDVar6;
  PropertyValueInfo *info_local;
  PropertyId propertyId_local;
  DynamicObject *this_local;
  
  BVar3 = IsInternalPropertyId(propertyId);
  if ((BVar3 != 0) && (propertyId != -1)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                ,0xff,
                                "(!Js::IsInternalPropertyId(propertyId) || propertyId == Js::Constants::NoProperty)"
                                ,
                                "!Js::IsInternalPropertyId(propertyId) || propertyId == Js::Constants::NoProperty"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pDVar6 = GetTypeHandler(this);
  val = (*pDVar6->_vptr_DynamicTypeHandler[0x11])(pDVar6,this,(ulong)(uint)propertyId,0,info);
  PVar4 = JavascriptConversion::BooleanToPropertyQueryFlags(val);
  return PVar4;
}

Assistant:

PropertyQueryFlags DynamicObject::HasPropertyQuery(PropertyId propertyId, _Inout_opt_ PropertyValueInfo* info)
    {
        // HasProperty can be invoked with propertyId = NoProperty in some cases, namely cross-thread and DOM
        // This is done to force creation of a type handler in case the type handler is deferred
        Assert(!Js::IsInternalPropertyId(propertyId) || propertyId == Js::Constants::NoProperty);
        return JavascriptConversion::BooleanToPropertyQueryFlags(GetTypeHandler()->HasProperty(this, propertyId, nullptr /*pNoRedecl*/, info));
    }